

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O0

bool __thiscall
wasm::
SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
::operator==(SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
             *this,SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                   *other)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  const_iterator ppLVar4;
  const_iterator ppLVar5;
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  *other_local;
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  *this_local;
  
  sVar2 = size(this);
  sVar3 = size(other);
  if (sVar2 == sVar3) {
    bVar1 = usingFixed(this);
    if (bVar1) {
      ppLVar4 = std::array<wasm::LocalSet_*,_2UL>::begin
                          (&(this->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage);
      ppLVar5 = std::array<wasm::LocalSet_*,_2UL>::begin
                          (&(this->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage);
      this_local._7_1_ =
           std::operator==(ppLVar4,ppLVar5 + (this->fixed).
                                             super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used,
                           (anon_class_8_1_a86c6e30)other);
    }
    else {
      bVar1 = usingFixed(other);
      if (bVar1) {
        ppLVar4 = std::array<wasm::LocalSet_*,_2UL>::begin
                            (&(other->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage);
        ppLVar5 = std::array<wasm::LocalSet_*,_2UL>::begin
                            (&(other->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage);
        this_local._7_1_ =
             std::operator==(ppLVar4,ppLVar5 + (other->fixed).
                                               super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used,
                             (anon_class_8_1_8991fb9c)this);
      }
      else {
        this_local._7_1_ = std::operator==(&this->flexible,&other->flexible);
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
  operator==(const SmallSetBase<T, N, FixedStorage, FlexibleSet>& other) const {
    if (size() != other.size()) {
      return false;
    }
    if (usingFixed()) {
      return std::all_of(fixed.storage.begin(),
                         fixed.storage.begin() + fixed.used,
                         [&other](const T& x) { return other.count(x); });
    } else if (other.usingFixed()) {
      return std::all_of(other.fixed.storage.begin(),
                         other.fixed.storage.begin() + other.fixed.used,
                         [this](const T& x) { return count(x); });
    } else {
      return flexible == other.flexible;
    }
  }